

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::exception<kratos::StmtException>::exception
          (exception<kratos::StmtException> *this,handle scope,char *name,handle base)

{
  char **ppcVar1;
  bool bVar2;
  int iVar3;
  handle *handle;
  undefined8 *puVar4;
  long *plVar5;
  PyObject *pPVar6;
  size_type *psVar7;
  long *plVar8;
  char *pcVar9;
  undefined8 uVar10;
  undefined1 local_e8 [24];
  object local_d0;
  size_type *local_c8;
  string full_name;
  long local_a0;
  char *local_98;
  handle hStack_90;
  char **local_88;
  PyObject *local_80;
  char *local_78;
  object oStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48;
  char *name_local;
  exception<kratos::StmtException> *local_38;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  local_e8._16_8_ = "__name__";
  local_d0.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_e8._8_8_ = scope.m_ptr;
  local_48 = name;
  handle = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                      ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e8)->
            super_handle;
  cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&full_name.field_2 + 8),handle);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,".","");
  pcVar9 = (char *)0xf;
  if ((char **)full_name.field_2._8_8_ != &local_98) {
    pcVar9 = local_98;
  }
  if (pcVar9 < (char *)(local_68._M_string_length + local_a0)) {
    uVar10 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar10 = local_68.field_2._M_allocated_capacity;
    }
    if ((char *)(local_68._M_string_length + local_a0) <= (ulong)uVar10) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,full_name.field_2._8_8_)
      ;
      goto LAB_002e91f9;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append
                     (full_name.field_2._M_local_buf + 8,(ulong)local_68._M_dataplus._M_p);
LAB_002e91f9:
  local_88 = &local_78;
  ppcVar1 = (char **)(puVar4 + 2);
  if ((char **)*puVar4 == ppcVar1) {
    local_78 = *ppcVar1;
    oStack_70.super_handle.m_ptr = (handle)puVar4[3];
  }
  else {
    local_78 = *ppcVar1;
    local_88 = (char **)*puVar4;
  }
  local_80 = (PyObject *)puVar4[1];
  *puVar4 = ppcVar1;
  puVar4[1] = 0;
  *(undefined1 *)ppcVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
  local_c8 = &full_name._M_string_length;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    full_name._M_string_length = *psVar7;
    full_name.field_2._M_allocated_capacity = plVar5[3];
  }
  else {
    full_name._M_string_length = *psVar7;
    local_c8 = (size_type *)*plVar5;
  }
  full_name._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,(ulong)(local_78 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((char **)full_name.field_2._8_8_ != &local_98) {
    operator_delete((void *)full_name.field_2._8_8_,(ulong)(local_98 + 1));
  }
  object::~object(&local_d0);
  pPVar6 = (PyObject *)PyErr_NewException(local_c8,base.m_ptr,0);
  (this->super_object).super_handle.m_ptr = pPVar6;
  iVar3 = PyObject_HasAttrString(scope.m_ptr,"__dict__");
  if (iVar3 == 1) {
    local_78 = "__dict__";
    oStack_70.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_80 = scope.m_ptr;
    local_38 = this;
    bVar2 = detail::
            object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const*&>
                      ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                        *)&local_88,&local_48);
    this = local_38;
    object::~object(&oStack_70);
  }
  else {
    bVar2 = false;
  }
  if (bVar2 != false) {
    local_38 = this;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,local_48,(allocator<char> *)((long)&name_local + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   "Error during initialization: multiple incompatible definitions with name \"",
                   &local_68);
    plVar5 = (long *)std::__cxx11::string::append(local_e8);
    full_name.field_2._8_8_ = *plVar5;
    plVar8 = plVar5 + 2;
    if ((long *)full_name.field_2._8_8_ == plVar8) {
      local_98 = (char *)*plVar8;
      hStack_90.m_ptr = (PyObject *)plVar5[3];
      full_name.field_2._8_8_ = &local_98;
    }
    else {
      local_98 = (char *)*plVar8;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pybind11_fail((string *)((long)&full_name.field_2 + 8));
  }
  local_98 = local_48;
  hStack_90.m_ptr = (PyObject *)0x0;
  detail::accessor_policies::str_attr::set(scope,local_48,(this->super_object).super_handle.m_ptr);
  object::~object((object *)&hStack_90);
  if (local_c8 != &full_name._M_string_length) {
    operator_delete(local_c8,full_name._M_string_length + 1);
  }
  return;
}

Assistant:

exception(handle scope, const char *name, handle base = PyExc_Exception) {
        std::string full_name = scope.attr("__name__").cast<std::string>() +
                                std::string(".") + name;
        m_ptr = PyErr_NewException(const_cast<char *>(full_name.c_str()), base.ptr(), NULL);
        if (hasattr(scope, "__dict__") && scope.attr("__dict__").contains(name))
            pybind11_fail("Error during initialization: multiple incompatible "
                          "definitions with name \"" + std::string(name) + "\"");
        scope.attr(name) = *this;
    }